

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1612e9d::AV1LbdInvTxfm2d_gt_int16_Test::TestBody
          (AV1LbdInvTxfm2d_gt_int16_Test *this)

{
  TxType tx_type;
  bool bVar1;
  int iVar2;
  uint8_t i;
  long lVar3;
  TxSize sz;
  
  for (iVar2 = 0; iVar2 != 0x13; iVar2 = iVar2 + 1) {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      tx_type = ""[lVar3];
      bVar1 = libaom_test::IsTxSizeTypeValid((TX_SIZE)iVar2,tx_type);
      if (bVar1) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (&this->super_AV1LbdInvTxfm2d,tx_type,(TX_SIZE)iVar2,1,1);
      }
    }
  }
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, gt_int16) {
  static const TxType types[] = { DCT_DCT, ADST_DCT, FLIPADST_DCT, IDTX,
                                  V_DCT,   H_DCT,    H_ADST,       H_FLIPADST };
  for (int j = 0; j < (int)(TX_SIZES_ALL); ++j) {
    const TxSize sz = static_cast<TxSize>(j);
    for (uint8_t i = 0; i < sizeof(types) / sizeof(types[0]); ++i) {
      const TxType tp = types[i];
      if (libaom_test::IsTxSizeTypeValid(sz, tp)) {
        RunAV1InvTxfm2dTest(tp, sz, 1, 1);
      }
    }
  }
}